

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O0

int av1_find_best_sub_pixel_tree
              (MACROBLOCKD *xd,AV1_COMMON *cm,SUBPEL_MOTION_SEARCH_PARAMS *ms_params,MV start_mv,
              FULLPEL_MV_STATS *start_mv_stats,MV *bestmv,int *distortion,uint *sse1,
              int_mv *last_mv_search_list)

{
  int iVar1;
  MV MVar2;
  short sVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  SubpelMvLimits *pSVar8;
  int *piVar9;
  SubpelMvLimits *mv_limits_00;
  MACROBLOCKD *xd_00;
  MV in_ECX;
  int *in_RDX;
  long in_RSI;
  long in_RDI;
  int *in_R8;
  MV *in_R9;
  SubpelMvLimits *in_stack_00000008;
  SUBPEL_SEARCH_VAR_PARAMS *in_stack_00000010;
  int_mv *in_stack_00000018;
  MV diag_step;
  MV iter_center_mv;
  int iter;
  int is_scaled;
  scale_factors *sf;
  uint besterr;
  int hstep;
  int round;
  SubpelMvLimits *mv_limits;
  SUBPEL_SEARCH_TYPE subpel_search_type;
  SUBPEL_SEARCH_VAR_PARAMS *var_params;
  MV_COST_PARAMS *mv_cost_params;
  int iters_per_step;
  int forced_stop;
  int allow_hp;
  MV diag_mv;
  uint down;
  uint up;
  uint right;
  uint left;
  MV bottom_mv;
  MV top_mv;
  MV right_mv;
  MV left_mv;
  int dummy;
  MV diag_step_1;
  MV diag_mv_1;
  uint down_1;
  MV bottom_mv_1;
  uint up_1;
  MV top_mv_1;
  uint right_1;
  MV right_mv_1;
  uint left_1;
  int dummy_1;
  MV left_mv_1;
  MV diag_step_2;
  int has_better_mv;
  MV diag_bias_mv;
  MV col_bias_mv;
  MV row_bias_mv;
  int thismse_7;
  uint sse_7;
  uint cost_7;
  int thismse_6;
  uint sse_6;
  uint cost_6;
  int thismse_5;
  uint sse_5;
  uint cost_5;
  int thismse_4;
  uint sse_4;
  uint cost_4;
  int thismse_3;
  uint sse_3;
  uint cost_3;
  int thismse_2;
  uint sse_2;
  uint cost_2;
  int thismse_1;
  uint sse_1;
  uint cost_1;
  int thismse;
  uint sse;
  uint cost;
  int *in_stack_0000bad0;
  uint *in_stack_0000bad8;
  MV_COST_PARAMS *in_stack_0000bae0;
  SUBPEL_SEARCH_VAR_PARAMS *in_stack_0000bae8;
  MV *in_stack_0000baf0;
  MACROBLOCKD *in_stack_0000baf8;
  uint *in_stack_0000bb60;
  SUBPEL_SEARCH_VAR_PARAMS *in_stack_0000bb68;
  MV *in_stack_0000bb70;
  AV1_COMMON *in_stack_0000bb78;
  MACROBLOCKD *in_stack_0000bb80;
  SubpelMvLimits *in_stack_fffffffffffffa58;
  MV_COST_PARAMS *in_stack_fffffffffffffa60;
  SUBPEL_SEARCH_VAR_PARAMS *in_stack_fffffffffffffa68;
  MV *in_stack_fffffffffffffa70;
  AV1_COMMON *in_stack_fffffffffffffa78;
  undefined4 in_stack_fffffffffffffa80;
  undefined4 in_stack_fffffffffffffa84;
  AV1_COMMON *in_stack_fffffffffffffa88;
  int local_564;
  MV in_stack_fffffffffffffaa0;
  MV in_stack_fffffffffffffaa4;
  MV in_stack_fffffffffffffaa8;
  short sVar10;
  short sVar11;
  int iter_00;
  MACROBLOCKD *distortion_00;
  undefined4 in_stack_fffffffffffffac0;
  int is_scaled_00;
  uint local_4d4;
  MV local_4d0;
  uint local_4cc;
  uint local_4c8;
  uint local_4c4;
  uint local_4c0;
  MV local_4bc;
  MV local_4b8;
  MV local_4b4;
  MV local_4b0;
  uint local_4ac;
  SubpelMvLimits *local_4a8;
  SUBPEL_SEARCH_VAR_PARAMS *local_4a0;
  uint *local_498;
  SubpelMvLimits *local_490;
  int *local_488;
  SubpelMvLimits *local_480;
  int local_474;
  MV *local_470;
  long local_468;
  long local_460;
  undefined4 local_454;
  MV local_450;
  short local_44c;
  short local_44a;
  uint local_448;
  short local_444;
  undefined2 local_442;
  uint local_440;
  short local_43c;
  undefined2 local_43a;
  uint local_438;
  undefined2 local_434;
  short local_432;
  uint local_430;
  MV local_42c;
  short local_428;
  short local_426;
  int local_424;
  SubpelMvLimits *local_420;
  SUBPEL_SEARCH_VAR_PARAMS *local_418;
  undefined1 *local_410;
  SubpelMvLimits *local_408;
  int *local_400;
  SubpelMvLimits *local_3f8;
  int local_3ec;
  undefined4 local_3cc;
  MV local_3c8;
  MV local_3c4;
  MV local_3c0;
  MV local_3bc;
  MV local_3b8;
  int local_3b4;
  SubpelMvLimits *local_3b0;
  SUBPEL_SEARCH_VAR_PARAMS *local_3a8;
  uint *local_3a0;
  SubpelMvLimits *local_398;
  int *local_390;
  SubpelMvLimits *local_388;
  MV *local_380;
  long local_378;
  long local_370;
  MV local_364;
  undefined4 local_360;
  int local_35c;
  undefined4 local_358;
  uint local_354;
  MV *local_350;
  SubpelMvLimits *local_348;
  SUBPEL_SEARCH_VAR_PARAMS *local_340;
  uint *local_338;
  SubpelMvLimits *local_330;
  int *local_328;
  SubpelMvLimits *local_320;
  MV *local_318;
  MV *local_310;
  long local_308;
  long local_300;
  int local_2f4;
  undefined4 local_2f0;
  uint local_2ec;
  MV *local_2e8;
  SubpelMvLimits *local_2e0;
  SUBPEL_SEARCH_VAR_PARAMS *local_2d8;
  uint *local_2d0;
  SubpelMvLimits *local_2c8;
  int *local_2c0;
  SubpelMvLimits *local_2b8;
  MV *local_2b0;
  MV *local_2a8;
  long local_2a0;
  long local_298;
  int local_28c;
  undefined4 local_288;
  uint local_284;
  MV *local_280;
  SubpelMvLimits *local_278;
  SUBPEL_SEARCH_VAR_PARAMS *local_270;
  uint *local_268;
  SubpelMvLimits *local_260;
  int *local_258;
  SubpelMvLimits *local_250;
  MV *local_248;
  MV *local_240;
  int local_224;
  undefined4 local_220;
  uint local_21c;
  uint *local_218;
  SubpelMvLimits *local_210;
  SUBPEL_SEARCH_VAR_PARAMS *local_208;
  uint *local_200;
  SubpelMvLimits *local_1f8;
  int *local_1f0;
  SubpelMvLimits *local_1e8;
  MV *local_1e0;
  MV *local_1d8;
  long local_1d0;
  long local_1c8;
  int local_1bc;
  undefined4 local_1b8;
  uint local_1b4;
  uint *local_1b0;
  SubpelMvLimits *local_1a8;
  SUBPEL_SEARCH_VAR_PARAMS *local_1a0;
  uint *local_198;
  SubpelMvLimits *local_190;
  int *local_188;
  SubpelMvLimits *local_180;
  MV *local_178;
  MV *local_170;
  long local_168;
  long local_160;
  int local_154;
  undefined4 local_150;
  uint local_14c;
  uint *local_148;
  SubpelMvLimits *local_140;
  SUBPEL_SEARCH_VAR_PARAMS *local_138;
  uint *local_130;
  SubpelMvLimits *local_128;
  int *local_120;
  SubpelMvLimits *local_118;
  MV *local_110;
  MV *local_108;
  long local_100;
  long local_f8;
  int local_ec;
  undefined4 local_e8;
  uint local_e4;
  uint *local_e0;
  SubpelMvLimits *local_d8;
  SUBPEL_SEARCH_VAR_PARAMS *local_d0;
  uint *local_c8;
  SubpelMvLimits *local_c0;
  int *local_b8;
  SubpelMvLimits *local_b0;
  MV *local_a8;
  MV *local_a0;
  long local_98;
  long local_90;
  int local_84;
  undefined4 local_80;
  uint local_7c;
  uint *local_78;
  SubpelMvLimits *local_70;
  SUBPEL_SEARCH_VAR_PARAMS *local_68;
  uint *local_60;
  SubpelMvLimits *local_58;
  int *local_50;
  SubpelMvLimits *local_48;
  MV *local_40;
  MV *local_38;
  
  uVar5 = (uint)*(byte *)(in_RDX + 4);
  iVar1 = in_RDX[5];
  pSVar8 = (SubpelMvLimits *)(in_RDX + 10);
  piVar9 = in_RDX + 0x16;
  iVar4 = in_RDX[0x18];
  mv_limits_00 = (SubpelMvLimits *)(in_RDX + 6);
  if ((int)(3 - (uint)((*in_RDX != 0 ^ 0xffU) & 1)) <= (int)(3 - uVar5)) {
    uVar5 = (uint)((*in_RDX != 0 ^ 0xffU) & 1);
  }
  local_564 = -uVar5 + 3;
  is_scaled_00 = 4;
  *in_R9 = in_ECX;
  iVar6 = is_intrabc_block((MB_MODE_INFO *)**(undefined8 **)(in_RDI + 0x1eb8));
  if (iVar6 == 0) {
    xd_00 = *(MACROBLOCKD **)(in_RDI + 0x1f08);
  }
  else {
    xd_00 = (MACROBLOCKD *)(in_RSI + 0x110);
  }
  distortion_00 = xd_00;
  iVar6 = av1_is_scaled((scale_factors *)in_stack_fffffffffffffa60);
  if ((in_R8 == (int *)0x0) || (iVar6 != 0)) {
    if ((char)iVar4 == '\0') {
      local_4d4 = setup_center_error(in_stack_0000baf8,in_stack_0000baf0,in_stack_0000bae8,
                                     in_stack_0000bae0,in_stack_0000bad8,in_stack_0000bad0);
    }
    else {
      in_stack_fffffffffffffa58 = in_stack_00000008;
      local_4d4 = upsampled_setup_center_error
                            ((MACROBLOCKD *)
                             CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                             in_stack_fffffffffffffa78,in_stack_fffffffffffffa70,
                             in_stack_fffffffffffffa68,in_stack_fffffffffffffa60,
                             (uint *)in_stack_00000008,&xd_00->mi_row);
    }
  }
  else {
    local_4d4 = in_R8[1] + *in_R8;
    in_stack_00000008->col_min = in_R8[1];
    *(int *)&in_stack_00000010->vfp = in_R8[2];
  }
  if (-uVar5 != -3) {
    for (iter_00 = 0; iter_00 < local_564; iter_00 = iter_00 + 1) {
      MVar2 = *in_R9;
      sVar10 = MVar2.row;
      sVar11 = MVar2.col;
      iVar7 = check_repeated_mv_and_update(in_stack_00000018,MVar2,iter_00);
      if (iVar7 != 0) {
        return 0x7fffffff;
      }
      sVar3 = (short)is_scaled_00;
      if ((char)iVar4 == '\0') {
        local_3cc = CONCAT22(sVar11,sVar10);
        local_410 = &stack0xfffffffffffffac4;
        local_418 = in_stack_00000010;
        local_420 = in_stack_00000008;
        local_426 = sVar11 - sVar3;
        local_42c.row = 0;
        local_42c.col = 0;
        local_428 = sVar10;
        local_424 = iVar6;
        local_408 = pSVar8;
        local_400 = piVar9;
        local_3f8 = mv_limits_00;
        local_3ec = is_scaled_00;
        local_430 = check_better_fast(xd_00,in_stack_fffffffffffffa88,
                                      (MV *)CONCAT44(in_stack_fffffffffffffa84,iVar6),&local_42c,
                                      in_stack_00000008,in_stack_00000010,
                                      (MV_COST_PARAMS *)
                                      CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                                      (uint *)CONCAT26(sVar11,CONCAT24(sVar10,
                                                  in_stack_fffffffffffffaa8)),
                                      (uint *)CONCAT44(iVar6,iter_00),&distortion_00->mi_row,
                                      (int *)CONCAT44(local_4d4,in_stack_fffffffffffffac0),
                                      is_scaled_00);
        local_434 = (short)local_3cc;
        local_432 = local_3cc._2_2_ + (short)local_3ec;
        local_438 = check_better_fast(xd_00,in_stack_fffffffffffffa88,
                                      (MV *)CONCAT44(in_stack_fffffffffffffa84,local_424),&local_42c
                                      ,local_420,local_418,
                                      (MV_COST_PARAMS *)
                                      CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                                      (uint *)CONCAT26(sVar11,CONCAT24(sVar10,
                                                  in_stack_fffffffffffffaa8)),
                                      (uint *)CONCAT44(iVar6,iter_00),&distortion_00->mi_row,
                                      (int *)CONCAT44(local_4d4,in_stack_fffffffffffffac0),
                                      is_scaled_00);
        local_43c = (short)local_3cc - (short)local_3ec;
        local_43a = local_3cc._2_2_;
        local_440 = check_better_fast(xd_00,in_stack_fffffffffffffa88,
                                      (MV *)CONCAT44(in_stack_fffffffffffffa84,local_424),&local_42c
                                      ,local_420,local_418,
                                      (MV_COST_PARAMS *)
                                      CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                                      (uint *)CONCAT26(sVar11,CONCAT24(sVar10,
                                                  in_stack_fffffffffffffaa8)),
                                      (uint *)CONCAT44(iVar6,iter_00),&distortion_00->mi_row,
                                      (int *)CONCAT44(local_4d4,in_stack_fffffffffffffac0),
                                      is_scaled_00);
        local_444 = (short)local_3cc + (short)local_3ec;
        local_442 = local_3cc._2_2_;
        local_448 = check_better_fast(xd_00,in_stack_fffffffffffffa88,
                                      (MV *)CONCAT44(in_stack_fffffffffffffa84,local_424),&local_42c
                                      ,local_420,local_418,
                                      (MV_COST_PARAMS *)
                                      CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                                      (uint *)CONCAT26(sVar11,CONCAT24(sVar10,
                                                  in_stack_fffffffffffffaa8)),
                                      (uint *)CONCAT44(iVar6,iter_00),&distortion_00->mi_row,
                                      (int *)CONCAT44(local_4d4,in_stack_fffffffffffffac0),
                                      is_scaled_00);
        local_3c8 = get_best_diag_step(local_3ec,local_430,local_438,local_440,local_448);
        local_44c = (short)local_3cc + local_3c8.row;
        local_44a = local_3cc._2_2_ + local_3c8.col;
        in_stack_fffffffffffffa58 = local_408;
        check_better_fast(xd_00,in_stack_fffffffffffffa88,
                          (MV *)CONCAT44(in_stack_fffffffffffffa84,local_424),&local_42c,local_420,
                          local_418,
                          (MV_COST_PARAMS *)
                          CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                          (uint *)CONCAT26(sVar11,CONCAT24(sVar10,in_stack_fffffffffffffaa8)),
                          (uint *)CONCAT44(iVar6,iter_00),&distortion_00->mi_row,
                          (int *)CONCAT44(local_4d4,in_stack_fffffffffffffac0),is_scaled_00);
        in_stack_fffffffffffffaa0 = local_3c8;
        in_stack_fffffffffffffaa8 = local_3c8;
      }
      else {
        local_454 = CONCAT22(sVar11,sVar10);
        local_498 = (uint *)&stack0xfffffffffffffac4;
        local_4a0 = in_stack_00000010;
        local_4a8 = in_stack_00000008;
        local_4ac = 0;
        local_4b0.col = sVar11 - sVar3;
        local_4b0.row = sVar10;
        local_4b4.col = sVar11 + sVar3;
        local_4b4.row = sVar10;
        local_4b8.col = sVar11;
        local_4b8.row = sVar10 - sVar3;
        local_4bc.col = sVar11;
        local_4bc.row = sVar10 + sVar3;
        local_38 = &local_4b0;
        local_68 = in_stack_00000010;
        local_70 = in_stack_00000008;
        local_78 = &local_4ac;
        local_490 = pSVar8;
        local_488 = piVar9;
        local_480 = mv_limits_00;
        local_474 = is_scaled_00;
        local_470 = in_R9;
        local_468 = in_RSI;
        local_460 = in_RDI;
        local_60 = local_498;
        local_58 = pSVar8;
        local_50 = piVar9;
        local_48 = mv_limits_00;
        local_40 = in_R9;
        iVar7 = av1_is_subpelmv_in_range(mv_limits_00,local_4b0);
        if (iVar7 == 0) {
          local_7c = 0x7fffffff;
        }
        else {
          local_84 = upsampled_pref_error
                               (in_stack_0000bb80,in_stack_0000bb78,in_stack_0000bb70,
                                in_stack_0000bb68,in_stack_0000bb60);
          iVar7 = mv_err_cost_((MV *)in_stack_fffffffffffffa58,(MV_COST_PARAMS *)0x265a46);
          local_7c = local_84 + iVar7;
          if (local_7c < *local_60) {
            *local_60 = local_7c;
            *local_40 = *local_38;
            local_70->col_min = local_84;
            *(undefined4 *)&local_68->vfp = local_80;
            *local_78 = *local_78 | 1;
          }
        }
        local_4c0 = local_7c;
        local_90 = local_460;
        local_98 = local_468;
        local_a0 = &local_4b4;
        local_a8 = local_470;
        local_b0 = local_480;
        local_b8 = local_488;
        local_c0 = local_490;
        local_c8 = local_498;
        local_d0 = local_4a0;
        local_d8 = local_4a8;
        local_e0 = &local_4ac;
        iVar7 = av1_is_subpelmv_in_range(local_480,local_4b4);
        if (iVar7 == 0) {
          local_e4 = 0x7fffffff;
        }
        else {
          local_ec = upsampled_pref_error
                               (in_stack_0000bb80,in_stack_0000bb78,in_stack_0000bb70,
                                in_stack_0000bb68,in_stack_0000bb60);
          iVar7 = mv_err_cost_((MV *)in_stack_fffffffffffffa58,(MV_COST_PARAMS *)0x265bff);
          local_e4 = local_ec + iVar7;
          if (local_e4 < *local_c8) {
            *local_c8 = local_e4;
            *local_a8 = *local_a0;
            local_d8->col_min = local_ec;
            *(undefined4 *)&local_d0->vfp = local_e8;
            *local_e0 = *local_e0 | 1;
          }
        }
        local_4c4 = local_e4;
        local_f8 = local_460;
        local_100 = local_468;
        local_108 = &local_4b8;
        local_110 = local_470;
        local_118 = local_480;
        local_120 = local_488;
        local_128 = local_490;
        local_130 = local_498;
        local_138 = local_4a0;
        local_140 = local_4a8;
        local_148 = &local_4ac;
        iVar7 = av1_is_subpelmv_in_range(local_480,local_4b8);
        if (iVar7 == 0) {
          local_14c = 0x7fffffff;
        }
        else {
          local_154 = upsampled_pref_error
                                (in_stack_0000bb80,in_stack_0000bb78,in_stack_0000bb70,
                                 in_stack_0000bb68,in_stack_0000bb60);
          iVar7 = mv_err_cost_((MV *)in_stack_fffffffffffffa58,(MV_COST_PARAMS *)0x265db8);
          local_14c = local_154 + iVar7;
          if (local_14c < *local_130) {
            *local_130 = local_14c;
            *local_110 = *local_108;
            local_140->col_min = local_154;
            *(undefined4 *)&local_138->vfp = local_150;
            *local_148 = *local_148 | 1;
          }
        }
        local_4c8 = local_14c;
        local_160 = local_460;
        local_168 = local_468;
        local_170 = &local_4bc;
        local_178 = local_470;
        local_180 = local_480;
        local_188 = local_488;
        local_190 = local_490;
        local_198 = local_498;
        local_1a0 = local_4a0;
        local_1a8 = local_4a8;
        local_1b0 = &local_4ac;
        iVar7 = av1_is_subpelmv_in_range(local_480,local_4bc);
        if (iVar7 == 0) {
          local_1b4 = 0x7fffffff;
        }
        else {
          local_1bc = upsampled_pref_error
                                (in_stack_0000bb80,in_stack_0000bb78,in_stack_0000bb70,
                                 in_stack_0000bb68,in_stack_0000bb60);
          iVar7 = mv_err_cost_((MV *)in_stack_fffffffffffffa58,(MV_COST_PARAMS *)0x265f71);
          local_1b4 = local_1bc + iVar7;
          if (local_1b4 < *local_198) {
            *local_198 = local_1b4;
            *local_178 = *local_170;
            local_1a8->col_min = local_1bc;
            *(undefined4 *)&local_1a0->vfp = local_1b8;
            *local_1b0 = *local_1b0 | 1;
          }
        }
        local_4cc = local_1b4;
        local_450 = get_best_diag_step(local_474,local_4c0,local_4c4,local_4c8,local_1b4);
        local_4d0.col = local_454._2_2_ + local_450.col;
        local_4d0.row = (short)local_454 + local_450.row;
        local_1c8 = local_460;
        local_1d0 = local_468;
        local_1d8 = &local_4d0;
        local_1e0 = local_470;
        local_1e8 = local_480;
        local_1f0 = local_488;
        local_1f8 = local_490;
        local_200 = local_498;
        local_208 = local_4a0;
        local_210 = local_4a8;
        local_218 = &local_4ac;
        iVar7 = av1_is_subpelmv_in_range(local_480,local_4d0);
        if (iVar7 == 0) {
          local_21c = 0x7fffffff;
          in_stack_fffffffffffffaa4 = local_450;
          in_stack_fffffffffffffaa8 = local_450;
        }
        else {
          local_224 = upsampled_pref_error
                                (in_stack_0000bb80,in_stack_0000bb78,in_stack_0000bb70,
                                 in_stack_0000bb68,in_stack_0000bb60);
          iVar7 = mv_err_cost_((MV *)in_stack_fffffffffffffa58,(MV_COST_PARAMS *)0x26618e);
          local_21c = local_224 + iVar7;
          in_stack_fffffffffffffaa4 = local_450;
          in_stack_fffffffffffffaa8 = local_450;
          if (local_21c < *local_200) {
            *local_200 = local_21c;
            *local_1e0 = *local_1d8;
            local_210->col_min = local_224;
            *(undefined4 *)&local_208->vfp = local_220;
            *local_218 = *local_218 | 1;
            in_stack_fffffffffffffaa4 = local_450;
            in_stack_fffffffffffffaa8 = local_450;
          }
        }
      }
      if (((sVar10 != in_R9->row) || (sVar11 != in_R9->col)) && (1 < iVar1)) {
        local_360 = CONCAT22(sVar11,sVar10);
        local_3a0 = (uint *)&stack0xfffffffffffffac4;
        local_3a8 = in_stack_00000010;
        local_3b0 = in_stack_00000008;
        local_3b4 = iVar6;
        local_398 = pSVar8;
        local_390 = piVar9;
        local_388 = mv_limits_00;
        if ((sVar10 != in_R9->row) || (local_364 = in_stack_fffffffffffffaa8, sVar11 != in_R9->col))
        {
          local_364.row = in_stack_fffffffffffffaa8.row;
          local_364.col = in_stack_fffffffffffffaa8.col;
          if (sVar10 == in_R9->row) {
            local_364.row = -local_364.row;
            MVar2 = local_364;
          }
          else {
            MVar2 = in_stack_fffffffffffffaa8;
            if (sVar11 == in_R9->col) {
              local_364.col = -local_364.col;
              MVar2 = local_364;
            }
          }
          local_364 = MVar2;
          local_3b8.col = in_R9->col;
          local_3b8.row = in_R9->row + local_364.row;
          local_3bc.col = in_R9->col + local_364.col;
          local_3bc.row = in_R9->row;
          local_3c0.col = in_R9->col + local_364.col;
          local_3c0.row = in_R9->row + local_364.row;
          local_3c4.row = 0;
          local_3c4.col = 0;
          if ((char)in_RDX[0x18] == '\0') {
            check_better_fast(xd_00,in_stack_fffffffffffffa88,
                              (MV *)CONCAT44(in_stack_fffffffffffffa84,iVar6),&local_3c4,
                              in_stack_00000008,in_stack_00000010,
                              (MV_COST_PARAMS *)
                              CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                              (uint *)CONCAT26(sVar11,CONCAT24(sVar10,in_stack_fffffffffffffaa8)),
                              (uint *)CONCAT44(iVar6,iter_00),&distortion_00->mi_row,
                              (int *)CONCAT44(local_4d4,in_stack_fffffffffffffac0),is_scaled_00);
            in_stack_fffffffffffffa58 = local_398;
            check_better_fast(xd_00,in_stack_fffffffffffffa88,
                              (MV *)CONCAT44(in_stack_fffffffffffffa84,local_3b4),&local_3c4,
                              local_3b0,local_3a8,
                              (MV_COST_PARAMS *)
                              CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                              (uint *)CONCAT26(sVar11,CONCAT24(sVar10,in_stack_fffffffffffffaa8)),
                              (uint *)CONCAT44(iVar6,iter_00),&distortion_00->mi_row,
                              (int *)CONCAT44(local_4d4,in_stack_fffffffffffffac0),is_scaled_00);
            if (local_3c4 != (MV)0x0) {
              in_stack_fffffffffffffa58 = local_398;
              check_better_fast(xd_00,in_stack_fffffffffffffa88,
                                (MV *)CONCAT44(in_stack_fffffffffffffa84,local_3b4),&local_3c4,
                                local_3b0,local_3a8,
                                (MV_COST_PARAMS *)
                                CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                                (uint *)CONCAT26(sVar11,CONCAT24(sVar10,in_stack_fffffffffffffaa8)),
                                (uint *)CONCAT44(iVar6,iter_00),&distortion_00->mi_row,
                                (int *)CONCAT44(local_4d4,in_stack_fffffffffffffac0),is_scaled_00);
            }
          }
          else {
            local_240 = &local_3b8;
            local_270 = in_stack_00000010;
            local_278 = in_stack_00000008;
            local_280 = &local_3c4;
            local_380 = in_R9;
            local_378 = in_RSI;
            local_370 = in_RDI;
            local_268 = local_3a0;
            local_260 = pSVar8;
            local_258 = piVar9;
            local_250 = mv_limits_00;
            local_248 = in_R9;
            iVar7 = av1_is_subpelmv_in_range(mv_limits_00,local_3b8);
            if (iVar7 == 0) {
              local_284 = 0x7fffffff;
            }
            else {
              local_28c = upsampled_pref_error
                                    (in_stack_0000bb80,in_stack_0000bb78,in_stack_0000bb70,
                                     in_stack_0000bb68,in_stack_0000bb60);
              iVar7 = mv_err_cost_((MV *)in_stack_fffffffffffffa58,(MV_COST_PARAMS *)0x2669e8);
              local_284 = local_28c + iVar7;
              if (local_284 < *local_268) {
                *local_268 = local_284;
                *local_248 = *local_240;
                local_278->col_min = local_28c;
                *(undefined4 *)&local_270->vfp = local_288;
                *local_280 = (MV)((uint)*local_280 | 1);
              }
            }
            local_298 = local_370;
            local_2a0 = local_378;
            local_2a8 = &local_3bc;
            local_2b0 = local_380;
            local_2b8 = local_388;
            local_2c0 = local_390;
            local_2c8 = local_398;
            local_2d0 = local_3a0;
            local_2d8 = local_3a8;
            local_2e0 = local_3b0;
            local_2e8 = &local_3c4;
            iVar7 = av1_is_subpelmv_in_range(local_388,local_3bc);
            if (iVar7 == 0) {
              local_2ec = 0x7fffffff;
            }
            else {
              local_2f4 = upsampled_pref_error
                                    (in_stack_0000bb80,in_stack_0000bb78,in_stack_0000bb70,
                                     in_stack_0000bb68,in_stack_0000bb60);
              iVar7 = mv_err_cost_((MV *)in_stack_fffffffffffffa58,(MV_COST_PARAMS *)0x266b93);
              local_2ec = local_2f4 + iVar7;
              if (local_2ec < *local_2d0) {
                *local_2d0 = local_2ec;
                *local_2b0 = *local_2a8;
                local_2e0->col_min = local_2f4;
                *(undefined4 *)&local_2d8->vfp = local_2f0;
                *local_2e8 = (MV)((uint)*local_2e8 | 1);
              }
            }
            if (local_3c4 != (MV)0x0) {
              local_300 = local_370;
              local_308 = local_378;
              local_310 = &local_3c0;
              local_318 = local_380;
              local_320 = local_388;
              local_328 = local_390;
              local_330 = local_398;
              local_338 = local_3a0;
              local_340 = local_3a8;
              local_348 = local_3b0;
              local_350 = &local_3c4;
              iVar7 = av1_is_subpelmv_in_range(local_388,local_3c0);
              if (iVar7 == 0) {
                local_354 = 0x7fffffff;
              }
              else {
                local_35c = upsampled_pref_error
                                      (in_stack_0000bb80,in_stack_0000bb78,in_stack_0000bb70,
                                       in_stack_0000bb68,in_stack_0000bb60);
                iVar7 = mv_err_cost_((MV *)in_stack_fffffffffffffa58,(MV_COST_PARAMS *)0x266d4c);
                local_354 = local_35c + iVar7;
                if (local_354 < *local_338) {
                  *local_338 = local_354;
                  *local_318 = *local_310;
                  local_348->col_min = local_35c;
                  *(undefined4 *)&local_340->vfp = local_358;
                  *local_350 = (MV)((uint)*local_350 | 1);
                }
              }
            }
          }
        }
      }
      is_scaled_00 = is_scaled_00 >> 1;
    }
  }
  return local_4d4;
}

Assistant:

int av1_find_best_sub_pixel_tree(MACROBLOCKD *xd, const AV1_COMMON *const cm,
                                 const SUBPEL_MOTION_SEARCH_PARAMS *ms_params,
                                 MV start_mv,
                                 const FULLPEL_MV_STATS *start_mv_stats,
                                 MV *bestmv, int *distortion,
                                 unsigned int *sse1,
                                 int_mv *last_mv_search_list) {
  (void)start_mv_stats;
  const int allow_hp = ms_params->allow_hp;
  const int forced_stop = ms_params->forced_stop;
  const int iters_per_step = ms_params->iters_per_step;
  const MV_COST_PARAMS *mv_cost_params = &ms_params->mv_cost_params;
  const SUBPEL_SEARCH_VAR_PARAMS *var_params = &ms_params->var_params;
  const SUBPEL_SEARCH_TYPE subpel_search_type =
      ms_params->var_params.subpel_search_type;
  const SubpelMvLimits *mv_limits = &ms_params->mv_limits;

  // How many steps to take. A round of 0 means fullpel search only, 1 means
  // half-pel, and so on.
  const int round = AOMMIN(FULL_PEL - forced_stop, 3 - !allow_hp);
  int hstep = INIT_SUBPEL_STEP_SIZE;  // Step size, initialized to 4/8=1/2 pel

  unsigned int besterr = INT_MAX;

  *bestmv = start_mv;

  const struct scale_factors *const sf = is_intrabc_block(xd->mi[0])
                                             ? &cm->sf_identity
                                             : xd->block_ref_scale_factors[0];
  const int is_scaled = av1_is_scaled(sf);

  if (start_mv_stats != NULL && !is_scaled) {
    besterr = start_mv_stats->distortion + start_mv_stats->err_cost;
    *distortion = start_mv_stats->distortion;
    *sse1 = start_mv_stats->sse;
  } else {
    if (subpel_search_type != USE_2_TAPS_ORIG) {
      besterr = upsampled_setup_center_error(xd, cm, bestmv, var_params,
                                             mv_cost_params, sse1, distortion);
    } else {
      besterr = setup_center_error(xd, bestmv, var_params, mv_cost_params, sse1,
                                   distortion);
    }
  }

  // If forced_stop is FULL_PEL, return.
  if (!round) return besterr;

  for (int iter = 0; iter < round; ++iter) {
    MV iter_center_mv = *bestmv;
    if (check_repeated_mv_and_update(last_mv_search_list, iter_center_mv,
                                     iter)) {
      return INT_MAX;
    }

    MV diag_step;
    if (subpel_search_type != USE_2_TAPS_ORIG) {
      diag_step = first_level_check(xd, cm, iter_center_mv, bestmv, hstep,
                                    mv_limits, var_params, mv_cost_params,
                                    &besterr, sse1, distortion);
    } else {
      diag_step = first_level_check_fast(xd, cm, iter_center_mv, bestmv, hstep,
                                         mv_limits, var_params, mv_cost_params,
                                         &besterr, sse1, distortion, is_scaled);
    }

    // Check diagonal sub-pixel position
    if (!CHECK_MV_EQUAL(iter_center_mv, *bestmv) && iters_per_step > 1) {
      second_level_check_v2(xd, cm, iter_center_mv, diag_step, bestmv,
                            mv_limits, var_params, mv_cost_params, &besterr,
                            sse1, distortion, is_scaled);
    }

    hstep >>= 1;
  }

  return besterr;
}